

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  AnsiPortListSyntax *pAVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *in_stack_00000110;
  
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  deepClone<slang::syntax::MemberSyntax>(in_stack_00000110,in_stack_00000108);
  TVar3 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AnsiPortListSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      (Token *)TVar3.info);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AnsiPortListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AnsiPortListSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone(node.ports, alloc),
        node.closeParen.deepClone(alloc)
    );
}